

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckUses
          (ScalarReplacementPass *this,Instruction *inst,VariableStats *stats)

{
  uint64_t uVar1;
  DefUseManager *this_00;
  bool ok;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  uVar1 = GetMaxLegalIndex(this,inst);
  ok = true;
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = ::operator_new(0x20);
  *(ScalarReplacementPass **)local_50._M_unused._0_8_ = this;
  *(uint64_t *)((long)local_50._M_unused._0_8_ + 8) = uVar1;
  *(VariableStats **)((long)local_50._M_unused._0_8_ + 0x10) = stats;
  *(bool **)((long)local_50._M_unused._0_8_ + 0x18) = &ok;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp:746:39)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp:746:39)>
             ::_M_manager;
  analysis::DefUseManager::ForEachUse
            (this_00,inst,(function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return ok;
}

Assistant:

bool ScalarReplacementPass::CheckUses(const Instruction* inst,
                                      VariableStats* stats) const {
  uint64_t max_legal_index = GetMaxLegalIndex(inst);

  bool ok = true;
  get_def_use_mgr()->ForEachUse(inst, [this, max_legal_index, stats, &ok](
                                          const Instruction* user,
                                          uint32_t index) {
    if (user->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare ||
        user->GetCommonDebugOpcode() == CommonDebugInfoDebugValue) {
      // TODO: include num_partial_accesses if it uses Fragment operation or
      // DebugValue has Indexes operand.
      stats->num_full_accesses++;
      return;
    }

    // Annotations are check as a group separately.
    if (!IsAnnotationInst(user->opcode())) {
      switch (user->opcode()) {
        case spv::Op::OpAccessChain:
        case spv::Op::OpInBoundsAccessChain:
          if (index == 2u && user->NumInOperands() > 1) {
            uint32_t id = user->GetSingleWordInOperand(1u);
            const Instruction* opInst = get_def_use_mgr()->GetDef(id);
            const auto* constant =
                context()->get_constant_mgr()->GetConstantFromInst(opInst);
            if (!constant) {
              ok = false;
            } else if (constant->GetZeroExtendedValue() >= max_legal_index) {
              ok = false;
            } else {
              if (!CheckUsesRelaxed(user)) ok = false;
            }
            stats->num_partial_accesses++;
          } else {
            ok = false;
          }
          break;
        case spv::Op::OpLoad:
          if (!CheckLoad(user, index)) ok = false;
          stats->num_full_accesses++;
          break;
        case spv::Op::OpStore:
          if (!CheckStore(user, index)) ok = false;
          stats->num_full_accesses++;
          break;
        case spv::Op::OpName:
        case spv::Op::OpMemberName:
          break;
        default:
          ok = false;
          break;
      }
    }
  });

  return ok;
}